

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  RTCRayQueryContext *pRVar14;
  undefined8 uVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  RayQueryContext *pRVar31;
  RayQueryContext *pRVar32;
  uint uVar34;
  long lVar35;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  AABBNodeMB4D *node1;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  RTCRayQueryContext *pRVar43;
  float fVar44;
  float fVar57;
  float fVar58;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  float fVar60;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar77;
  float fVar78;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar71;
  float fVar79;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar85;
  float fVar86;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar99;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  undefined1 auVar98 [16];
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  vbool<4> valid;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  long local_11a0;
  long local_1198;
  long local_1190;
  Scene *local_1188;
  undefined1 (*local_1180) [16];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  float local_10c8 [4];
  float local_10b8 [4];
  undefined1 local_10a8 [16];
  float local_1098 [4];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar33;
  float fVar100;
  
  pRVar31 = (RayQueryContext *)(stack + 1);
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar117 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar100 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar115 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar118 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar28 = (tray->tnear).field_0.i[k];
  iVar137 = (tray->tfar).field_0.i[k];
  auVar73._4_4_ = iVar137;
  auVar73._0_4_ = iVar137;
  auVar73._8_4_ = iVar137;
  auVar73._12_4_ = iVar137;
  local_1180 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1018 = fVar117;
  fStack_1014 = fVar117;
  fStack_1010 = fVar117;
  fStack_100c = fVar117;
  local_1028 = fVar100;
  fStack_1024 = fVar100;
  fStack_1020 = fVar100;
  fStack_101c = fVar100;
  local_1038 = fVar115;
  fStack_1034 = fVar115;
  fStack_1030 = fVar115;
  fStack_102c = fVar115;
  local_1048 = fVar118;
  fStack_1044 = fVar118;
  fStack_1040 = fVar118;
  fStack_103c = fVar118;
  local_1058 = fVar44;
  fStack_1054 = fVar44;
  fStack_1050 = fVar44;
  fStack_104c = fVar44;
  local_1068 = fVar57;
  fStack_1064 = fVar57;
  fStack_1060 = fVar57;
  fStack_105c = fVar57;
  local_1078 = iVar28;
  iStack_1074 = iVar28;
  iStack_1070 = iVar28;
  iStack_106c = iVar28;
  iVar139 = iVar28;
  iVar138 = iVar28;
  iVar137 = iVar28;
  fVar102 = fVar57;
  fVar101 = fVar57;
  fVar99 = fVar57;
  fVar95 = fVar44;
  fVar87 = fVar44;
  fVar86 = fVar44;
  fVar85 = fVar118;
  fVar80 = fVar118;
  fVar79 = fVar118;
  fVar78 = fVar115;
  fVar77 = fVar115;
  fVar68 = fVar115;
  fVar67 = fVar100;
  fVar66 = fVar100;
  fVar65 = fVar100;
  fVar60 = fVar117;
  fVar59 = fVar117;
  fVar58 = fVar117;
LAB_0025b64c:
  do {
    pRVar32 = pRVar31 + -1;
    pRVar31 = (RayQueryContext *)&pRVar31[-1].user;
    if (*(float *)&pRVar32->args < *(float *)(ray + k * 4 + 0x80) ||
        *(float *)&pRVar32->args == *(float *)(ray + k * 4 + 0x80)) {
      pRVar43 = *(RTCRayQueryContext **)pRVar31;
      while (((ulong)pRVar43 & 8) == 0) {
        uVar40 = (ulong)pRVar43 & 0xfffffffffffffff0;
        fVar103 = *(float *)(ray + k * 4 + 0x70);
        pfVar5 = (float *)(uVar40 + 0x80 + uVar37);
        pfVar1 = (float *)(uVar40 + 0x20 + uVar37);
        auVar81._0_4_ = ((*pfVar5 * fVar103 + *pfVar1) - fVar58) * fVar79;
        auVar81._4_4_ = ((pfVar5[1] * fVar103 + pfVar1[1]) - fVar59) * fVar80;
        auVar81._8_4_ = ((pfVar5[2] * fVar103 + pfVar1[2]) - fVar60) * fVar85;
        auVar81._12_4_ = ((pfVar5[3] * fVar103 + pfVar1[3]) - fVar117) * fVar118;
        auVar69._4_4_ = iVar138;
        auVar69._0_4_ = iVar137;
        auVar69._8_4_ = iVar139;
        auVar69._12_4_ = iVar28;
        auVar69 = maxps(auVar69,auVar81);
        pfVar5 = (float *)(uVar40 + 0x80 + uVar39);
        pfVar1 = (float *)(uVar40 + 0x20 + uVar39);
        auVar91._0_4_ = ((*pfVar5 * fVar103 + *pfVar1) - fVar65) * fVar86;
        auVar91._4_4_ = ((pfVar5[1] * fVar103 + pfVar1[1]) - fVar66) * fVar87;
        auVar91._8_4_ = ((pfVar5[2] * fVar103 + pfVar1[2]) - fVar67) * fVar95;
        auVar91._12_4_ = ((pfVar5[3] * fVar103 + pfVar1[3]) - fVar100) * fVar44;
        pfVar5 = (float *)(uVar40 + 0x80 + uVar42);
        pfVar1 = (float *)(uVar40 + 0x20 + uVar42);
        auVar97._0_4_ = ((*pfVar5 * fVar103 + *pfVar1) - fVar68) * fVar99;
        auVar97._4_4_ = ((pfVar5[1] * fVar103 + pfVar1[1]) - fVar77) * fVar101;
        auVar97._8_4_ = ((pfVar5[2] * fVar103 + pfVar1[2]) - fVar78) * fVar102;
        auVar97._12_4_ = ((pfVar5[3] * fVar103 + pfVar1[3]) - fVar115) * fVar57;
        auVar81 = maxps(auVar91,auVar97);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar69,auVar81);
        pfVar5 = (float *)(uVar40 + 0x80 + (uVar37 ^ 0x10));
        pfVar1 = (float *)(uVar40 + 0x20 + (uVar37 ^ 0x10));
        auVar88._0_4_ = ((*pfVar5 * fVar103 + *pfVar1) - fVar58) * fVar79;
        auVar88._4_4_ = ((pfVar5[1] * fVar103 + pfVar1[1]) - fVar59) * fVar80;
        auVar88._8_4_ = ((pfVar5[2] * fVar103 + pfVar1[2]) - fVar60) * fVar85;
        auVar88._12_4_ = ((pfVar5[3] * fVar103 + pfVar1[3]) - fVar117) * fVar118;
        pfVar5 = (float *)(uVar40 + 0x80 + (uVar39 ^ 0x10));
        pfVar1 = (float *)(uVar40 + 0x20 + (uVar39 ^ 0x10));
        auVar92._0_4_ = ((*pfVar5 * fVar103 + *pfVar1) - fVar65) * fVar86;
        auVar92._4_4_ = ((pfVar5[1] * fVar103 + pfVar1[1]) - fVar66) * fVar87;
        auVar92._8_4_ = ((pfVar5[2] * fVar103 + pfVar1[2]) - fVar67) * fVar95;
        auVar92._12_4_ = ((pfVar5[3] * fVar103 + pfVar1[3]) - fVar100) * fVar44;
        pfVar5 = (float *)(uVar40 + 0x80 + (uVar42 ^ 0x10));
        pfVar1 = (float *)(uVar40 + 0x20 + (uVar42 ^ 0x10));
        auVar94._0_4_ = ((*pfVar5 * fVar103 + *pfVar1) - fVar68) * fVar99;
        auVar94._4_4_ = ((pfVar5[1] * fVar103 + pfVar1[1]) - fVar77) * fVar101;
        auVar94._8_4_ = ((pfVar5[2] * fVar103 + pfVar1[2]) - fVar78) * fVar102;
        auVar94._12_4_ = ((pfVar5[3] * fVar103 + pfVar1[3]) - fVar115) * fVar57;
        auVar81 = minps(auVar92,auVar94);
        auVar69 = minps(auVar73,auVar88);
        auVar69 = minps(auVar69,auVar81);
        if (((uint)pRVar43 & 7) == 6) {
          bVar22 = (fVar103 < *(float *)(uVar40 + 0xf0) && *(float *)(uVar40 + 0xe0) <= fVar103) &&
                   tNear.field_0._0_4_ <= auVar69._0_4_;
          bVar23 = (fVar103 < *(float *)(uVar40 + 0xf4) && *(float *)(uVar40 + 0xe4) <= fVar103) &&
                   tNear.field_0._4_4_ <= auVar69._4_4_;
          bVar24 = (fVar103 < *(float *)(uVar40 + 0xf8) && *(float *)(uVar40 + 0xe8) <= fVar103) &&
                   tNear.field_0._8_4_ <= auVar69._8_4_;
          bVar25 = (fVar103 < *(float *)(uVar40 + 0xfc) && *(float *)(uVar40 + 0xec) <= fVar103) &&
                   tNear.field_0._12_4_ <= auVar69._12_4_;
        }
        else {
          bVar22 = tNear.field_0._0_4_ <= auVar69._0_4_;
          bVar23 = tNear.field_0._4_4_ <= auVar69._4_4_;
          bVar24 = tNear.field_0._8_4_ <= auVar69._8_4_;
          bVar25 = tNear.field_0._12_4_ <= auVar69._12_4_;
        }
        auVar45._0_4_ = (uint)bVar22 * -0x80000000;
        auVar45._4_4_ = (uint)bVar23 * -0x80000000;
        auVar45._8_4_ = (uint)bVar24 * -0x80000000;
        auVar45._12_4_ = (uint)bVar25 * -0x80000000;
        uVar34 = movmskps((int)root.ptr,auVar45);
        if (uVar34 == 0) {
          root.ptr = (size_t)stack;
          if (pRVar31 == (RayQueryContext *)root.ptr) {
            return;
          }
          goto LAB_0025b64c;
        }
        uVar34 = uVar34 & 0xff;
        root.ptr = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> root.ptr & 1) == 0;
              root.ptr = (long)&((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr + 1) {
          }
        }
        pRVar43 = *(RTCRayQueryContext **)(uVar40 + root.ptr * 8);
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 != 0) {
          uVar129 = tNear.field_0.i[root.ptr];
          lVar36 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
            }
          }
          pRVar14 = *(RTCRayQueryContext **)(uVar40 + lVar36 * 8);
          uVar130 = tNear.field_0.i[lVar36];
          uVar34 = uVar34 - 1 & uVar34;
          root.ptr = (size_t)uVar34;
          if (uVar34 == 0) {
            if (uVar129 < uVar130) {
              ((NodeRefPtr<4> *)&pRVar31->scene)->ptr = (size_t)pRVar14;
              *(uint *)&pRVar31->user = uVar130;
              pRVar31 = (RayQueryContext *)&pRVar31->args;
            }
            else {
              ((NodeRefPtr<4> *)&pRVar31->scene)->ptr = (size_t)pRVar43;
              *(uint *)&pRVar31->user = uVar129;
              pRVar31 = (RayQueryContext *)&pRVar31->args;
              pRVar43 = pRVar14;
            }
          }
          else {
            auVar70._8_4_ = uVar129;
            auVar70._0_8_ = pRVar43;
            auVar70._12_4_ = 0;
            auVar89._8_4_ = uVar130;
            auVar89._0_8_ = pRVar14;
            auVar89._12_4_ = 0;
            lVar36 = 0;
            if ((RayQueryContext *)root.ptr != (RayQueryContext *)0x0) {
              for (; (uVar34 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            uVar15 = *(undefined8 *)(uVar40 + lVar36 * 8);
            iVar13 = tNear.field_0.i[lVar36];
            auVar82._8_4_ = iVar13;
            auVar82._0_8_ = uVar15;
            auVar82._12_4_ = 0;
            auVar46._8_4_ = -(uint)((int)uVar129 < (int)uVar130);
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              auVar93._8_4_ = uVar130;
              auVar93._0_8_ = pRVar14;
              auVar93._12_4_ = 0;
              auVar81 = blendvps(auVar93,auVar70,auVar46);
              auVar69 = blendvps(auVar70,auVar89,auVar46);
              auVar47._8_4_ = -(uint)(auVar81._8_4_ < iVar13);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              auVar90._8_4_ = iVar13;
              auVar90._0_8_ = uVar15;
              auVar90._12_4_ = 0;
              auVar91 = blendvps(auVar90,auVar81,auVar47);
              auVar94 = blendvps(auVar81,auVar82,auVar47);
              auVar48._8_4_ = -(uint)(auVar69._8_4_ < auVar94._8_4_);
              auVar48._4_4_ = auVar48._8_4_;
              auVar48._0_4_ = auVar48._8_4_;
              auVar48._12_4_ = auVar48._8_4_;
              auVar81 = blendvps(auVar94,auVar69,auVar48);
              SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar69,auVar94,auVar48);
              *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar31 = SVar71;
              *(undefined1 (*) [16])&pRVar31->args = auVar81;
              pRVar43 = auVar91._0_8_;
              pRVar31 = (RayQueryContext *)&pRVar31[1].user;
            }
            else {
              root.ptr = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> root.ptr & 1) == 0;
                    root.ptr = (long)&((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr
                               + 1) {
                }
              }
              auVar49._4_4_ = auVar46._8_4_;
              auVar49._0_4_ = auVar46._8_4_;
              auVar49._8_4_ = auVar46._8_4_;
              auVar49._12_4_ = auVar46._8_4_;
              auVar94 = blendvps(auVar89,auVar70,auVar49);
              auVar69 = blendvps(auVar70,auVar89,auVar49);
              auVar96._8_4_ = tNear.field_0.i[root.ptr];
              auVar96._0_8_ = *(undefined8 *)(uVar40 + root.ptr * 8);
              auVar96._12_4_ = 0;
              auVar50._8_4_ = -(uint)(iVar13 < tNear.field_0.i[root.ptr]);
              auVar50._4_4_ = auVar50._8_4_;
              auVar50._0_4_ = auVar50._8_4_;
              auVar50._12_4_ = auVar50._8_4_;
              auVar91 = blendvps(auVar96,auVar82,auVar50);
              auVar81 = blendvps(auVar82,auVar96,auVar50);
              auVar51._8_4_ = -(uint)(auVar69._8_4_ < auVar81._8_4_);
              auVar51._4_4_ = auVar51._8_4_;
              auVar51._0_4_ = auVar51._8_4_;
              auVar51._12_4_ = auVar51._8_4_;
              auVar97 = blendvps(auVar81,auVar69,auVar51);
              SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar69,auVar81,auVar51);
              auVar52._8_4_ = -(uint)(auVar94._8_4_ < auVar91._8_4_);
              auVar52._4_4_ = auVar52._8_4_;
              auVar52._0_4_ = auVar52._8_4_;
              auVar52._12_4_ = auVar52._8_4_;
              auVar69 = blendvps(auVar91,auVar94,auVar52);
              auVar91 = blendvps(auVar94,auVar91,auVar52);
              auVar53._8_4_ = -(uint)(auVar91._8_4_ < auVar97._8_4_);
              auVar53._4_4_ = auVar53._8_4_;
              auVar53._0_4_ = auVar53._8_4_;
              auVar53._12_4_ = auVar53._8_4_;
              auVar81 = blendvps(auVar97,auVar91,auVar53);
              auVar91 = blendvps(auVar91,auVar97,auVar53);
              *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar31 = SVar71;
              *(undefined1 (*) [16])&pRVar31->args = auVar91;
              pRVar31[1].user = (RTCRayQueryContext *)auVar81._0_8_;
              pRVar31[1].args = (RTCIntersectArguments *)auVar81._8_8_;
              pRVar43 = auVar69._0_8_;
              pRVar31 = pRVar31 + 2;
            }
          }
        }
      }
      lVar36 = (ulong)((uint)pRVar43 & 0xf) - 8;
      if (lVar36 != 0) {
        uVar40 = (ulong)pRVar43 & 0xfffffffffffffff0;
        lVar38 = 0;
        pRVar32 = pRVar31;
        do {
          lVar41 = lVar38 * 0x140;
          fVar117 = *(float *)(ray + k * 4 + 0x70);
          pfVar5 = (float *)(uVar40 + 0x90 + lVar41);
          pfVar1 = (float *)(uVar40 + lVar41);
          fVar44 = *pfVar5 * fVar117 + *pfVar1;
          fVar57 = pfVar5[1] * fVar117 + pfVar1[1];
          fVar58 = pfVar5[2] * fVar117 + pfVar1[2];
          fVar59 = pfVar5[3] * fVar117 + pfVar1[3];
          pfVar5 = (float *)(uVar40 + 0xa0 + lVar41);
          pfVar1 = (float *)(uVar40 + 0x10 + lVar41);
          fVar68 = *pfVar5 * fVar117 + *pfVar1;
          fVar77 = pfVar5[1] * fVar117 + pfVar1[1];
          fVar78 = pfVar5[2] * fVar117 + pfVar1[2];
          fVar79 = pfVar5[3] * fVar117 + pfVar1[3];
          pfVar5 = (float *)(uVar40 + 0xb0 + lVar41);
          pfVar1 = (float *)(uVar40 + 0x20 + lVar41);
          fVar80 = *pfVar5 * fVar117 + *pfVar1;
          fVar85 = pfVar5[1] * fVar117 + pfVar1[1];
          fVar86 = pfVar5[2] * fVar117 + pfVar1[2];
          fVar87 = pfVar5[3] * fVar117 + pfVar1[3];
          pfVar6 = (float *)(uVar40 + 0xc0 + lVar41);
          pfVar1 = (float *)(uVar40 + 0x30 + lVar41);
          pfVar7 = (float *)(uVar40 + 0xd0 + lVar41);
          pfVar5 = (float *)(uVar40 + 0x40 + lVar41);
          pfVar8 = (float *)(uVar40 + 0xe0 + lVar41);
          pfVar2 = (float *)(uVar40 + 0x50 + lVar41);
          pfVar9 = (float *)(uVar40 + 0xf0 + lVar41);
          pfVar3 = (float *)(uVar40 + 0x60 + lVar41);
          pfVar10 = (float *)(uVar40 + 0x100 + lVar41);
          pfVar4 = (float *)(uVar40 + 0x70 + lVar41);
          pfVar11 = (float *)(uVar40 + 0x110 + lVar41);
          pfVar12 = (float *)(uVar40 + 0x80 + lVar41);
          fVar108 = fVar44 - (*pfVar6 * fVar117 + *pfVar1);
          fVar109 = fVar57 - (pfVar6[1] * fVar117 + pfVar1[1]);
          fVar110 = fVar58 - (pfVar6[2] * fVar117 + pfVar1[2]);
          fVar111 = fVar59 - (pfVar6[3] * fVar117 + pfVar1[3]);
          fVar116 = fVar68 - (*pfVar7 * fVar117 + *pfVar5);
          fVar119 = fVar77 - (pfVar7[1] * fVar117 + pfVar5[1]);
          fVar121 = fVar78 - (pfVar7[2] * fVar117 + pfVar5[2]);
          fVar123 = fVar79 - (pfVar7[3] * fVar117 + pfVar5[3]);
          fVar125 = fVar80 - (*pfVar8 * fVar117 + *pfVar2);
          fVar126 = fVar85 - (pfVar8[1] * fVar117 + pfVar2[1]);
          fVar127 = fVar86 - (pfVar8[2] * fVar117 + pfVar2[2]);
          fVar128 = fVar87 - (pfVar8[3] * fVar117 + pfVar2[3]);
          fVar60 = (*pfVar9 * fVar117 + *pfVar3) - fVar44;
          fVar65 = (pfVar9[1] * fVar117 + pfVar3[1]) - fVar57;
          fVar66 = (pfVar9[2] * fVar117 + pfVar3[2]) - fVar58;
          fVar67 = (pfVar9[3] * fVar117 + pfVar3[3]) - fVar59;
          fVar103 = (*pfVar10 * fVar117 + *pfVar4) - fVar68;
          fVar105 = (pfVar10[1] * fVar117 + pfVar4[1]) - fVar77;
          fVar106 = (pfVar10[2] * fVar117 + pfVar4[2]) - fVar78;
          fVar107 = (pfVar10[3] * fVar117 + pfVar4[3]) - fVar79;
          fVar95 = (fVar117 * *pfVar11 + *pfVar12) - fVar80;
          fVar99 = (fVar117 * pfVar11[1] + pfVar12[1]) - fVar85;
          fVar101 = (fVar117 * pfVar11[2] + pfVar12[2]) - fVar86;
          fVar102 = (fVar117 * pfVar11[3] + pfVar12[3]) - fVar87;
          local_10b8[0] = fVar125 * fVar103 - fVar116 * fVar95;
          local_10b8[1] = fVar126 * fVar105 - fVar119 * fVar99;
          local_10b8[2] = fVar127 * fVar106 - fVar121 * fVar101;
          local_10b8[3] = fVar128 * fVar107 - fVar123 * fVar102;
          fVar117 = *(float *)(ray + k * 4);
          fVar100 = *(float *)(ray + k * 4 + 0x10);
          fVar115 = *(float *)(ray + k * 4 + 0x40);
          fVar118 = *(float *)(ray + k * 4 + 0x50);
          fVar44 = fVar44 - fVar117;
          fVar57 = fVar57 - fVar117;
          fVar58 = fVar58 - fVar117;
          fVar59 = fVar59 - fVar117;
          fVar68 = fVar68 - fVar100;
          fVar77 = fVar77 - fVar100;
          fVar78 = fVar78 - fVar100;
          fVar79 = fVar79 - fVar100;
          fVar133 = fVar44 * fVar118 - fVar68 * fVar115;
          fVar134 = fVar57 * fVar118 - fVar77 * fVar115;
          fVar135 = fVar58 * fVar118 - fVar78 * fVar115;
          fVar136 = fVar59 * fVar118 - fVar79 * fVar115;
          local_10a8._0_4_ = fVar108 * fVar95 - fVar125 * fVar60;
          local_10a8._4_4_ = fVar109 * fVar99 - fVar126 * fVar65;
          local_10a8._8_4_ = fVar110 * fVar101 - fVar127 * fVar66;
          local_10a8._12_4_ = fVar111 * fVar102 - fVar128 * fVar67;
          fVar117 = *(float *)(ray + k * 4 + 0x20);
          fVar100 = *(float *)(ray + k * 4 + 0x60);
          fVar80 = fVar80 - fVar117;
          fVar85 = fVar85 - fVar117;
          fVar86 = fVar86 - fVar117;
          fVar87 = fVar87 - fVar117;
          fVar140 = fVar80 * fVar115 - fVar44 * fVar100;
          fVar141 = fVar85 * fVar115 - fVar57 * fVar100;
          fVar142 = fVar86 * fVar115 - fVar58 * fVar100;
          fVar143 = fVar87 * fVar115 - fVar59 * fVar100;
          local_1098[0] = fVar116 * fVar60 - fVar108 * fVar103;
          local_1098[1] = fVar119 * fVar65 - fVar109 * fVar105;
          local_1098[2] = fVar121 * fVar66 - fVar110 * fVar106;
          local_1098[3] = fVar123 * fVar67 - fVar111 * fVar107;
          fVar117 = fVar68 * fVar100 - fVar80 * fVar118;
          fVar120 = fVar77 * fVar100 - fVar85 * fVar118;
          fVar122 = fVar78 * fVar100 - fVar86 * fVar118;
          fVar124 = fVar79 * fVar100 - fVar87 * fVar118;
          fVar112 = fVar115 * local_10b8[0] + fVar118 * local_10a8._0_4_ + fVar100 * local_1098[0];
          fVar113 = fVar115 * local_10b8[1] + fVar118 * local_10a8._4_4_ + fVar100 * local_1098[1];
          fVar114 = fVar115 * local_10b8[2] + fVar118 * local_10a8._8_4_ + fVar100 * local_1098[2];
          fVar115 = fVar115 * local_10b8[3] + fVar118 * local_10a8._12_4_ + fVar100 * local_1098[3];
          uVar129 = (uint)fVar112 & 0x80000000;
          uVar130 = (uint)fVar113 & 0x80000000;
          uVar131 = (uint)fVar114 & 0x80000000;
          uVar132 = (uint)fVar115 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar60 * fVar117 + fVar103 * fVar140 + fVar95 * fVar133) ^ uVar129;
          tNear.field_0.i[1] =
               (uint)(fVar65 * fVar120 + fVar105 * fVar141 + fVar99 * fVar134) ^ uVar130;
          tNear.field_0.i[2] =
               (uint)(fVar66 * fVar122 + fVar106 * fVar142 + fVar101 * fVar135) ^ uVar131;
          tNear.field_0.i[3] =
               (uint)(fVar67 * fVar124 + fVar107 * fVar143 + fVar102 * fVar136) ^ uVar132;
          fVar118 = (float)((uint)(fVar117 * fVar108 + fVar140 * fVar116 + fVar133 * fVar125) ^
                           uVar129);
          fVar60 = (float)((uint)(fVar120 * fVar109 + fVar141 * fVar119 + fVar134 * fVar126) ^
                          uVar130);
          fVar65 = (float)((uint)(fVar122 * fVar110 + fVar142 * fVar121 + fVar135 * fVar127) ^
                          uVar131);
          fVar66 = (float)((uint)(fVar124 * fVar111 + fVar143 * fVar123 + fVar136 * fVar128) ^
                          uVar132);
          fVar117 = ABS(fVar112);
          fVar100 = ABS(fVar113);
          auVar98._0_8_ = CONCAT44(fVar113,fVar112) & 0x7fffffff7fffffff;
          auVar98._8_4_ = ABS(fVar114);
          auVar98._12_4_ = ABS(fVar115);
          bVar23 = ((0.0 <= fVar118 && 0.0 <= tNear.field_0.v[0]) && fVar112 != 0.0) &&
                   tNear.field_0.v[0] + fVar118 <= fVar117;
          auVar104._0_4_ = -(uint)bVar23;
          bVar25 = ((0.0 <= fVar60 && 0.0 <= tNear.field_0.v[1]) && fVar113 != 0.0) &&
                   tNear.field_0.v[1] + fVar60 <= fVar100;
          auVar104._4_4_ = -(uint)bVar25;
          bVar24 = ((0.0 <= fVar65 && 0.0 <= tNear.field_0.v[2]) && fVar114 != 0.0) &&
                   tNear.field_0.v[2] + fVar65 <= auVar98._8_4_;
          auVar104._8_4_ = -(uint)bVar24;
          bVar22 = ((0.0 <= fVar66 && 0.0 <= tNear.field_0.v[3]) && fVar115 != 0.0) &&
                   tNear.field_0.v[3] + fVar66 <= auVar98._12_4_;
          auVar104._12_4_ = -(uint)bVar22;
          uVar34 = movmskps((int)pRVar32,auVar104);
          pRVar32 = (RayQueryContext *)(ulong)uVar34;
          if (uVar34 != 0) {
            fVar44 = (float)(uVar129 ^
                            (uint)(fVar44 * local_10b8[0] +
                                  fVar68 * local_10a8._0_4_ + fVar80 * local_1098[0]));
            fVar57 = (float)(uVar130 ^
                            (uint)(fVar57 * local_10b8[1] +
                                  fVar77 * local_10a8._4_4_ + fVar85 * local_1098[1]));
            fVar58 = (float)(uVar131 ^
                            (uint)(fVar58 * local_10b8[2] +
                                  fVar78 * local_10a8._8_4_ + fVar86 * local_1098[2]));
            fVar59 = (float)(uVar132 ^
                            (uint)(fVar59 * local_10b8[3] +
                                  fVar79 * local_10a8._12_4_ + fVar87 * local_1098[3]));
            fVar115 = *(float *)(ray + k * 4 + 0x30);
            bVar18 = fVar115 * fVar117 < fVar44;
            bVar19 = fVar115 * fVar100 < fVar57;
            bVar20 = fVar115 * auVar98._8_4_ < fVar58;
            bVar21 = fVar115 * auVar98._12_4_ < fVar59;
            auVar72._4_4_ = -(uint)bVar19;
            auVar72._0_4_ = -(uint)bVar18;
            auVar72._8_4_ = -(uint)bVar20;
            auVar72._12_4_ = -(uint)bVar21;
            local_11c8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
            local_11c8._4_4_ = 0;
            local_11c8._8_4_ = 0;
            local_11c8._12_4_ = 0;
            valid.field_0.i[0] =
                 -(uint)((fVar44 <= (float)local_11c8._0_4_ * fVar117 && bVar18) && bVar23);
            valid.field_0.i[1] =
                 -(uint)((fVar57 <= (float)local_11c8._0_4_ * fVar100 && bVar19) && bVar25);
            valid.field_0.i[2] =
                 -(uint)((fVar58 <= (float)local_11c8._0_4_ * auVar98._8_4_ && bVar20) && bVar24);
            valid.field_0.i[3] =
                 -(uint)((fVar59 <= (float)local_11c8._0_4_ * auVar98._12_4_ && bVar21) && bVar22);
            uVar34 = movmskps(uVar34,(undefined1  [16])valid.field_0);
            pRVar32 = (RayQueryContext *)(ulong)uVar34;
            if (uVar34 != 0) {
              local_1188 = context->scene;
              auVar73 = rcpps(auVar72,auVar98);
              fVar115 = auVar73._0_4_;
              fVar67 = auVar73._4_4_;
              fVar68 = auVar73._8_4_;
              fVar77 = auVar73._12_4_;
              fVar115 = (1.0 - fVar117 * fVar115) * fVar115 + fVar115;
              fVar67 = (1.0 - fVar100 * fVar67) * fVar67 + fVar67;
              fVar68 = (1.0 - auVar98._8_4_ * fVar68) * fVar68 + fVar68;
              fVar77 = (1.0 - auVar98._12_4_ * fVar77) * fVar77 + fVar77;
              fVar44 = fVar44 * fVar115;
              fVar57 = fVar57 * fVar67;
              fVar58 = fVar58 * fVar68;
              fVar59 = fVar59 * fVar77;
              local_10c8[0] = fVar44;
              local_10c8[1] = fVar57;
              local_10c8[2] = fVar58;
              local_10c8[3] = fVar59;
              local_10e8[0] = tNear.field_0.v[0] * fVar115;
              local_10e8[1] = tNear.field_0.v[1] * fVar67;
              local_10e8[2] = tNear.field_0.v[2] * fVar68;
              local_10e8[3] = tNear.field_0.v[3] * fVar77;
              local_10d8[0] = fVar115 * fVar118;
              local_10d8[1] = fVar67 * fVar60;
              local_10d8[2] = fVar68 * fVar65;
              local_10d8[3] = fVar77 * fVar66;
              auVar26._4_4_ = fVar57;
              auVar26._0_4_ = fVar44;
              auVar26._8_4_ = fVar58;
              auVar26._12_4_ = fVar59;
              auVar69 = blendvps(_DAT_01f7a9f0,auVar26,(undefined1  [16])valid.field_0);
              auVar83._4_4_ = auVar69._0_4_;
              auVar83._0_4_ = auVar69._4_4_;
              auVar83._8_4_ = auVar69._12_4_;
              auVar83._12_4_ = auVar69._8_4_;
              auVar73 = minps(auVar83,auVar69);
              auVar61._0_8_ = auVar73._8_8_;
              auVar61._8_4_ = auVar73._0_4_;
              auVar61._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar61,auVar73);
              uVar34 = -(uint)(auVar73._0_4_ == auVar69._0_4_);
              uVar129 = -(uint)(auVar73._4_4_ == auVar69._4_4_);
              uVar130 = -(uint)(auVar73._8_4_ == auVar69._8_4_);
              uVar131 = -(uint)(auVar73._12_4_ == auVar69._12_4_);
              auVar76._4_4_ = uVar129;
              auVar76._0_4_ = uVar34;
              auVar74._0_4_ = uVar34 & valid.field_0.i[0];
              auVar74._4_4_ = uVar129 & valid.field_0.i[1];
              auVar74._8_4_ = uVar130 & valid.field_0.i[2];
              auVar74._12_4_ = uVar131 & valid.field_0.i[3];
              iVar28 = movmskps((int)local_1188,auVar74);
              auVar75._8_4_ = 0xffffffff;
              auVar75._0_8_ = 0xffffffffffffffff;
              auVar75._12_4_ = 0xffffffff;
              if (iVar28 != 0) {
                auVar76._8_4_ = uVar130;
                auVar76._12_4_ = uVar131;
                auVar75 = auVar76;
              }
              lVar41 = lVar41 + uVar40;
              auVar54._0_4_ = valid.field_0.i[0] & auVar75._0_4_;
              auVar54._4_4_ = valid.field_0.i[1] & auVar75._4_4_;
              auVar54._8_4_ = valid.field_0.i[2] & auVar75._8_4_;
              auVar54._12_4_ = valid.field_0.i[3] & auVar75._12_4_;
              uVar29 = movmskps(iVar28,auVar54);
              uVar33 = CONCAT44((int)((ulong)local_1188 >> 0x20),uVar29);
              lVar35 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
LAB_0025bd43:
              uVar34 = *(uint *)(lVar41 + 0x120 + lVar35 * 4);
              pGVar16 = (local_1188->geometries).items[uVar34].ptr;
              root.ptr = (size_t)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_11c8 + lVar35 * 4 + -0x10) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar117 = local_10e8[lVar35];
                  fVar100 = local_10d8[lVar35];
                  *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar35];
                  *(float *)(ray + k * 4 + 0xc0) = local_10b8[lVar35];
                  *(float *)(ray + k * 4 + 0xd0) = local_1098[lVar35 + -4];
                  *(float *)(ray + k * 4 + 0xe0) = local_1098[lVar35];
                  *(float *)(ray + k * 4 + 0xf0) = fVar117;
                  *(float *)(ray + k * 4 + 0x100) = fVar100;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(lVar41 + 0x130 + lVar35 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar34;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar34 = context->user->instPrimID[0];
                  pRVar32 = (RayQueryContext *)(ulong)uVar34;
                  *(uint *)(ray + k * 4 + 0x140) = uVar34;
                  root.ptr = (size_t)context;
                  goto LAB_0025bc03;
                }
                local_1088 = fVar44;
                fStack_1084 = fVar57;
                fStack_1080 = fVar58;
                fStack_107c = fVar59;
                h.u.field_0.v[0] = local_10e8[lVar35];
                h.v.field_0.v[0] = local_10d8[lVar35];
                fVar117 = local_10b8[lVar35];
                fVar100 = local_1098[lVar35 + -4];
                root.ptr = (size_t)context->user;
                h.geomID.field_0.i[1] = uVar34;
                h.geomID.field_0.i[0] = uVar34;
                h.geomID.field_0.i[2] = uVar34;
                h.geomID.field_0.i[3] = uVar34;
                uVar29 = *(undefined4 *)(lVar41 + 0x130 + lVar35 * 4);
                h.primID.field_0.i[1] = uVar29;
                h.primID.field_0.i[0] = uVar29;
                h.primID.field_0.i[2] = uVar29;
                h.primID.field_0.i[3] = uVar29;
                h.Ng.field_0._4_4_ = (int)fVar117;
                h.Ng.field_0._0_4_ = (int)fVar117;
                h.Ng.field_0._8_4_ = (int)fVar117;
                h.Ng.field_0._12_4_ = (int)fVar117;
                h.Ng.field_0._20_4_ = (int)fVar100;
                h.Ng.field_0._16_4_ = (int)fVar100;
                h.Ng.field_0._24_4_ = (int)fVar100;
                h.Ng.field_0._28_4_ = (int)fVar100;
                fVar117 = local_1098[lVar35];
                h.Ng.field_0._36_4_ = (int)fVar117;
                h.Ng.field_0._32_4_ = (int)fVar117;
                h.Ng.field_0._40_4_ = (int)fVar117;
                h.Ng.field_0._44_4_ = (int)fVar117;
                h.u.field_0.v[1] = h.u.field_0.v[0];
                h.u.field_0.v[2] = h.u.field_0.v[0];
                h.u.field_0.v[3] = h.u.field_0.v[0];
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                h.instID[0].field_0.i[0] =
                     (uint)((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr;
                h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[0] =
                     *(uint *)((long)&((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr
                              + 4);
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar35];
                local_11b8 = *local_1180;
                args.valid = (int *)local_11b8;
                args.geometryUserPtr = pGVar16->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                local_11a0 = lVar41;
                local_1198 = lVar38;
                local_1190 = lVar36;
                args.ray = (RTCRayN *)ray;
                if (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar16->intersectionFilterN)(&args);
                  root.ptr = (size_t)extraout_RDX;
                }
                if (local_11b8 == (undefined1  [16])0x0) {
                  auVar62._8_4_ = 0xffffffff;
                  auVar62._0_8_ = 0xffffffffffffffff;
                  auVar62._12_4_ = 0xffffffff;
                  auVar62 = auVar62 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var17 = context->args->filter;
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var17)(&args);
                    root.ptr = (size_t)extraout_RDX_00;
                  }
                  auVar55._0_4_ = -(uint)(local_11b8._0_4_ == 0);
                  auVar55._4_4_ = -(uint)(local_11b8._4_4_ == 0);
                  auVar55._8_4_ = -(uint)(local_11b8._8_4_ == 0);
                  auVar55._12_4_ = -(uint)(local_11b8._12_4_ == 0);
                  auVar62 = auVar55 ^ _DAT_01f7ae20;
                  if (local_11b8 != (undefined1  [16])0x0) {
                    auVar73 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar73;
                    auVar73 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar73;
                  }
                }
                if ((_DAT_01f7bb20 & auVar62) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_11c8._0_4_;
                }
                else {
                  local_11c8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_11c8 + lVar35 * 4 + -0x10) = 0;
                valid.field_0.i[0] =
                     -(uint)(local_1088 <= (float)local_11c8._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fStack_1084 <= (float)local_11c8._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fStack_1080 <= (float)local_11c8._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fStack_107c <= (float)local_11c8._0_4_) & valid.field_0.i[3];
                lVar36 = local_1190;
                lVar38 = local_1198;
                lVar41 = local_11a0;
                fVar44 = local_1088;
                fVar57 = fStack_1084;
                fVar58 = fStack_1080;
                fVar59 = fStack_107c;
              }
              uVar29 = (undefined4)((ulong)lVar35 >> 0x20);
              iVar28 = movmskps((int)lVar35,(undefined1  [16])valid.field_0);
              pRVar32 = (RayQueryContext *)CONCAT44(uVar29,iVar28);
              if (iVar28 == 0) goto LAB_0025bc03;
              auVar27._4_4_ = fVar57;
              auVar27._0_4_ = fVar44;
              auVar27._8_4_ = fVar58;
              auVar27._12_4_ = fVar59;
              auVar69 = blendvps(_DAT_01f7a9f0,auVar27,(undefined1  [16])valid.field_0);
              auVar84._4_4_ = auVar69._0_4_;
              auVar84._0_4_ = auVar69._4_4_;
              auVar84._8_4_ = auVar69._12_4_;
              auVar84._12_4_ = auVar69._8_4_;
              auVar73 = minps(auVar84,auVar69);
              auVar63._0_8_ = auVar73._8_8_;
              auVar63._8_4_ = auVar73._0_4_;
              auVar63._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar63,auVar73);
              auVar64._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar69._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar73._0_4_ == auVar69._0_4_) & valid.field_0._0_4_);
              auVar64._8_4_ = -(uint)(auVar73._8_4_ == auVar69._8_4_) & valid.field_0._8_4_;
              auVar64._12_4_ = -(uint)(auVar73._12_4_ == auVar69._12_4_) & valid.field_0._12_4_;
              iVar28 = movmskps(iVar28,auVar64);
              aVar56 = valid.field_0;
              if (iVar28 != 0) {
                aVar56.i[2] = auVar64._8_4_;
                aVar56._0_8_ = auVar64._0_8_;
                aVar56.i[3] = auVar64._12_4_;
              }
              uVar30 = movmskps(iVar28,(undefined1  [16])aVar56);
              uVar33 = CONCAT44(uVar29,uVar30);
              lVar35 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              goto LAB_0025bd43;
            }
          }
LAB_0025bc03:
          lVar38 = lVar38 + 1;
        } while (lVar38 != lVar36);
      }
      uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar73._4_4_ = uVar29;
      auVar73._0_4_ = uVar29;
      auVar73._8_4_ = uVar29;
      auVar73._12_4_ = uVar29;
      fVar58 = local_1018;
      fVar59 = fStack_1014;
      fVar60 = fStack_1010;
      fVar117 = fStack_100c;
      fVar65 = local_1028;
      fVar66 = fStack_1024;
      fVar67 = fStack_1020;
      fVar100 = fStack_101c;
      fVar68 = local_1038;
      fVar77 = fStack_1034;
      fVar78 = fStack_1030;
      fVar115 = fStack_102c;
      fVar79 = local_1048;
      fVar80 = fStack_1044;
      fVar85 = fStack_1040;
      fVar118 = fStack_103c;
      fVar86 = local_1058;
      fVar87 = fStack_1054;
      fVar95 = fStack_1050;
      fVar44 = fStack_104c;
      fVar99 = local_1068;
      fVar101 = fStack_1064;
      fVar102 = fStack_1060;
      fVar57 = fStack_105c;
      iVar137 = local_1078;
      iVar138 = iStack_1074;
      iVar139 = iStack_1070;
      iVar28 = iStack_106c;
    }
    if (pRVar31 == (RayQueryContext *)stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }